

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::
ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_>::tryEvaluateFunc
          (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *this,Term *trm
          ,TermList *res)

{
  anon_class_24_3_b5a48c42 action;
  bool bVar1;
  TermList *pTVar2;
  TermList arg1;
  TermList *in_RDX;
  TermList t;
  TermList out;
  BottomFirstIterator iter;
  Stack<Kernel::TermList> keep;
  ConstantType acc;
  uint nums;
  Term *in_stack_fffffffffffffea8;
  Term *t_00;
  TermList *in_stack_fffffffffffffeb0;
  TermList elem;
  IntegerConstantType *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  TermList in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Theory *in_stack_fffffffffffffee0;
  TermList local_f0;
  uint64_t local_e8;
  undefined8 local_e0;
  uint64_t local_d8;
  undefined8 local_d0;
  uint64_t local_c8;
  TermList local_c0;
  uint64_t local_b8;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  Stack<Kernel::TermList> local_58;
  undefined1 local_38 [24];
  TermList *local_20;
  bool local_1;
  
  local_38._20_4_ = 0;
  local_20 = in_RDX;
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (size_t)in_stack_fffffffffffffeb8);
  TermList::TermList(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  t_00 = (Term *)local_38;
  elem._content = (uint64_t)(local_38 + 0x14);
  action.nums = (uint *)elem._content;
  action.acc = (ConstantType *)t_00;
  action.keep = &local_58;
  stackTraverseIf<Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::TermList)_1_,Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::Term&)_1_>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,action);
  if ((local_38._20_4_ == 0) ||
     ((local_38._20_4_ == 1 &&
      (bVar1 = Kernel::operator!=((IntegerConstantType *)elem._content,(IntegerConstantType *)t_00),
      bVar1)))) {
    local_1 = false;
  }
  else {
    bVar1 = Kernel::operator!=((IntegerConstantType *)elem._content,(IntegerConstantType *)t_00);
    if (bVar1) {
      Theory::representConstant
                (in_stack_fffffffffffffee0,
                 (IntegerConstantType *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      TermList::TermList((TermList *)elem._content,t_00);
      Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)t_00,elem);
    }
    Lib::Stack<Kernel::TermList>::BottomFirstIterator::BottomFirstIterator
              ((BottomFirstIterator *)&stack0xffffffffffffff50,&local_58);
    bVar1 = Lib::Stack<Kernel::TermList>::BottomFirstIterator::hasNext
                      ((BottomFirstIterator *)&stack0xffffffffffffff50);
    if (bVar1) {
      pTVar2 = Lib::Stack<Kernel::TermList>::BottomFirstIterator::next
                         ((BottomFirstIterator *)&stack0xffffffffffffff50);
      local_c8 = pTVar2->_content;
      while (bVar1 = Lib::Stack<Kernel::TermList>::BottomFirstIterator::hasNext
                               ((BottomFirstIterator *)&stack0xffffffffffffff50), bVar1) {
        arg1._content =
             (uint64_t)
             Lib::Stack<Kernel::TermList>::BottomFirstIterator::next
                       ((BottomFirstIterator *)&stack0xffffffffffffff50);
        local_e0 = *(undefined8 *)arg1._content;
        local_e8 = local_c8;
        local_d0 = local_e0;
        in_stack_fffffffffffffec8._content =
             (uint64_t)Term::create2(in_stack_fffffffffffffec4,arg1,in_stack_fffffffffffffec8);
        TermList::TermList((TermList *)elem._content,t_00);
        local_c8 = local_d8;
      }
      local_20->_content = local_c8;
      TermList::TermList((TermList *)elem._content,t_00);
      local_1 = TermList::operator!=(&local_f0,local_20);
    }
    else {
      Theory::representConstant
                (in_stack_fffffffffffffee0,
                 (IntegerConstantType *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      TermList::TermList((TermList *)elem._content,t_00);
      local_20->_content = local_b8;
      TermList::TermList((TermList *)elem._content,t_00);
      local_1 = TermList::operator!=(&local_c0,local_20);
    }
  }
  Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)elem._content);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x881602);
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool tryEvaluateFunc(Term* trm, TermList& res) { 
    ASS_EQ(trm->functor(), _fun);
    ASS_EQ(trm->numTermArguments(),2);

    unsigned nums = 0;
    ConstantType acc = AbelianGroup::IDENTITY;
    Stack<TermList> keep;
    stackTraverseIf(TermList(trm), 
        /* we traverse only the parts with the same operation */
        [&](Term& t){ return t.functor() == _fun; },
        [&](TermList t) {
          ConstantType c;
          /* we eval constant parts */
          if (t.isTerm() && theory->tryInterpretConstant(t.term(), c)) {
            acc = AbelianGroup::groundEval(acc, c);
            nums++;
          } else {
            keep.push(t);
          }
        });
    if (nums == 0 || (nums == 1 && acc != AbelianGroup::IDENTITY)) {
      // only continue, if we updated acc more than once or at least saw a "_+0" somewhere
      return false;
    }

    if (acc != AbelianGroup::IDENTITY) {
      keep.push(TermList(theory->representConstant(acc)));
    }

    auto iter = Stack<TermList>::BottomFirstIterator(keep);
    if (!iter.hasNext()) {
      res = TermList(theory->representConstant(AbelianGroup::IDENTITY));
      return TermList(trm) != res;
    } else {
      TermList out = iter.next();
      while (iter.hasNext()) {
        auto t = iter.next();
        out = TermList(Term::create2(_fun, t, out));
      }
      res = out;
      return TermList(trm) != res;
    }
  }